

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Readable_String.h
# Opt level: O2

bool __thiscall
Jupiter::asBool<char>(Jupiter *this,basic_string_view<char,_std::char_traits<char>_> in_string)

{
  bool bVar1;
  basic_string_view<char,_std::char_traits<char>_> __x;
  basic_string_view<char,_std::char_traits<char>_> __x_00;
  basic_string_view<char,_std::char_traits<char>_> __x_01;
  basic_string_view<char,_std::char_traits<char>_> __x_02;
  basic_string_view<char,_std::char_traits<char>_> __x_03;
  basic_string_view<char,_std::char_traits<char>_> __x_04;
  basic_string_view<char,_std::char_traits<char>_> __y;
  basic_string_view<char,_std::char_traits<char>_> __y_00;
  basic_string_view<char,_std::char_traits<char>_> __y_01;
  basic_string_view<char,_std::char_traits<char>_> __y_02;
  basic_string_view<char,_std::char_traits<char>_> __y_03;
  basic_string_view<char,_std::char_traits<char>_> __y_04;
  
  __x._M_str = (char *)in_string._M_len;
  __x._M_len = (size_t)this;
  __y._M_str = "FALSE";
  __y._M_len = 5;
  bVar1 = std::operator==(__x,__y);
  if ((((!bVar1) &&
       (__x_00._M_str = __x._M_str, __x_00._M_len = (size_t)this, __y_00._M_str = "false",
       __y_00._M_len = 5, bVar1 = std::operator==(__x_00,__y_00), !bVar1)) &&
      (__x_01._M_str = __x._M_str, __x_01._M_len = (size_t)this, __y_01._M_str = "0",
      __y_01._M_len = 1, bVar1 = std::operator==(__x_01,__y_01), !bVar1)) &&
     ((__x_02._M_str = __x._M_str, __x_02._M_len = (size_t)this, __y_02._M_str = "OFF",
      __y_02._M_len = 3, bVar1 = std::operator==(__x_02,__y_02), !bVar1 &&
      (__x_03._M_str = __x._M_str, __x_03._M_len = (size_t)this, __y_03._M_str = "off",
      __y_03._M_len = 3, bVar1 = std::operator==(__x_03,__y_03), !bVar1)))) {
    __x_04._M_str = __x._M_str;
    __x_04._M_len = (size_t)this;
    __y_04._M_str = "-";
    __y_04._M_len = 1;
    bVar1 = std::operator==(__x_04,__y_04);
    return !bVar1;
  }
  return false;
}

Assistant:

bool asBool(std::basic_string_view<CharT> in_string) {
		using namespace std::literals;

		// Invert the logic here, so that we return true for numerics and "true"/"on"/"+", false otherwise
		// Note: temporarily removed case insensitivity, solely to avoid including unicode.hpp here
		if (in_string == "FALSE"sv
			|| in_string == "false"sv
			|| in_string == "0"sv
			|| in_string == "OFF"sv
			|| in_string == "off"sv
			|| in_string == "-"sv) {
			return false;
		}

		return true;
	}